

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O0

void __thiscall SQCompiler::EmitLoadConstInt(SQCompiler *this,SQInteger value,SQInteger target)

{
  SQFuncState *this_00;
  SQInteger arg1;
  SQInteger local_20;
  SQInteger target_local;
  SQInteger value_local;
  SQCompiler *this_local;
  
  local_20 = target;
  if (target < 0) {
    local_20 = SQFuncState::PushTarget(this->_fs,-1);
  }
  if ((value < 0x80000000) && (-0x80000000 < value)) {
    SQFuncState::AddInstruction(this->_fs,_OP_LOADINT,local_20,value,0,0);
  }
  else {
    this_00 = this->_fs;
    arg1 = SQFuncState::GetNumericConstant(this->_fs,value);
    SQFuncState::AddInstruction(this_00,_OP_LOAD,local_20,arg1,0,0);
  }
  return;
}

Assistant:

void EmitLoadConstInt(SQInteger value,SQInteger target)
    {
        if(target < 0) {
            target = _fs->PushTarget();
        }
        if(value <= INT_MAX && value > INT_MIN) { //does it fit in 32 bits?
            _fs->AddInstruction(_OP_LOADINT, target,value);
        }
        else {
            _fs->AddInstruction(_OP_LOAD, target, _fs->GetNumericConstant(value));
        }
    }